

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data_local;
  OpCode op_local;
  
  if ((op == LdEnvSlot) || (op == LdInnerSlot)) {
LAB_00b244f6:
    Output::Print(L" R%d = [%d][%d] ",(ulong)data->Value,(ulong)data->SlotIndex1,
                  (ulong)data->SlotIndex2);
  }
  else {
    if (1 < (ushort)(op - StEnvSlot)) {
      if (((op == LdInnerObjSlot) || (op == LdEnvObjSlot)) || (op == LdModuleSlot))
      goto LAB_00b244f6;
      if (((1 < (ushort)(op - StEnvSlotChkUndecl)) && (op != StInnerObjSlot)) &&
         ((op != StEnvObjSlot && (2 < (ushort)(op - StInnerObjSlotChkUndecl))))) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                    ,0x3b4,"(false)","Unknown OpCode for OpLayoutElementSlotI2");
        if (bVar2) {
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
          return;
        }
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    Output::Print(L" [%d][%d] = R%d ",(ulong)data->SlotIndex1,(ulong)data->SlotIndex2,
                  (ulong)data->Value);
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpElementSlotI2(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::StInnerSlot:
            case OpCode::StInnerSlotChkUndecl:
            case OpCode::StInnerObjSlot:
            case OpCode::StInnerObjSlotChkUndecl:
            case OpCode::StEnvSlot:
            case OpCode::StEnvObjSlot:
            case OpCode::StEnvSlotChkUndecl:
            case OpCode::StEnvObjSlotChkUndecl:
            case OpCode::StModuleSlot:
                Output::Print(_u(" [%d][%d] = R%d "),data->SlotIndex1, data->SlotIndex2, data->Value);
                break;
            case OpCode::LdInnerSlot:
            case OpCode::LdInnerObjSlot:
            case OpCode::LdEnvSlot:
            case OpCode::LdEnvObjSlot:
            case OpCode::LdModuleSlot:
                Output::Print(_u(" R%d = [%d][%d] "),data->Value, data->SlotIndex1, data->SlotIndex2);
                break;
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementSlotI2");
                break;
            }
        }
    }